

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O0

void __thiscall
http_status_line_parsing_simple01_Test::TestBody(http_status_line_parsing_simple01_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  Message local_68 [3];
  http_status_code local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  http_status_line status_line;
  sub_string str;
  http_status_line_parsing_simple01_Test *this_local;
  
  join_0x00000010_0x00000000_ = sub_string::literal<18ul>((char (*) [18])"HTTP/1.1 200 OK\r\n");
  parse_status_line((http_status_line *)&gtest_ar.message_,
                    (sub_string *)&status_line.reason_phrase.end_);
  local_4c = ok;
  testing::internal::EqHelper<false>::Compare<http_status_code,http_status_code>
            ((EqHelper<false> *)local_48,"status_line.status_code","http_status_code::ok",
             (http_status_code *)((long)&gtest_ar.message_.ptr_ + 4),&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0xc2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  bVar1 = sub_string::empty((sub_string *)&status_line.reason_phrase.end_);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_80,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_80,(AssertionResult *)0x1870b9,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  return;
}

Assistant:

TEST(http_status_line_parsing, simple01)
{
    sub_string str = sub_string::literal("HTTP/1.1 200 OK\r\n");
    http_status_line status_line = parse_status_line(str);
    EXPECT_EQ(status_line.status_code, http_status_code::ok);
    EXPECT_TRUE(str.empty());
}